

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O3

void __thiscall
helics::Filter::setFilterOperations(Filter *this,shared_ptr<helics::FilterOperations> *filterOps)

{
  uint uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Core *pCVar3;
  element_type *peVar4;
  undefined8 local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  peVar4 = (filterOps->super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var2 = (filterOps->super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (filterOps->super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (filterOps->super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->filtOp).super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar4;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (this->filtOp).super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->filtOp).super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    peVar4 = (this->filtOp).super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  }
  pCVar3 = (this->super_Interface).mCore;
  uVar1 = (this->super_Interface).handle.hid;
  if (peVar4 == (element_type *)0x0) {
    local_28 = 0;
    p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    (*peVar4->_vptr_FilterOperations[6])(&local_28);
  }
  (*pCVar3->_vptr_Core[0x54])(pCVar3,(ulong)uVar1,&local_28);
  if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
  }
  return;
}

Assistant:

void Filter::setFilterOperations(std::shared_ptr<FilterOperations> filterOps)
{
    filtOp = std::move(filterOps);
    mCore->setFilterOperator(handle, (filtOp) ? filtOp->getOperator() : nullptr);
}